

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldRefIterator<double>::RepeatedFieldRefIterator
          (RepeatedFieldRefIterator<double> *this,void *data,RepeatedFieldAccessor *accessor,
          bool begin)

{
  pointer local_60;
  void *local_50;
  bool begin_local;
  RepeatedFieldAccessor *accessor_local;
  void *data_local;
  RepeatedFieldRefIterator<double> *this_local;
  
  this->data_ = data;
  this->accessor_ = accessor;
  if (begin) {
    local_50 = (void *)(**(code **)(*(long *)accessor + 0x48))(accessor,data);
  }
  else {
    local_50 = (void *)(**(code **)(*(long *)accessor + 0x50))(accessor,data);
  }
  this->iterator_ = local_50;
  if (begin) {
    local_60 = (pointer)operator_new(8);
  }
  else {
    local_60 = (pointer)0x0;
  }
  std::unique_ptr<double,std::default_delete<double>>::unique_ptr<std::default_delete<double>,void>
            ((unique_ptr<double,std::default_delete<double>> *)&this->scratch_space_,local_60);
  return;
}

Assistant:

RepeatedFieldRefIterator(
      const void* PROTOBUF_NONNULL data,
      const RepeatedFieldAccessor* PROTOBUF_NONNULL accessor, bool begin)
      : data_(data),
        accessor_(accessor),
        iterator_(begin ? accessor->BeginIterator(data)
                        : accessor->EndIterator(data)),
        // The end iterator must not be dereferenced, no need for scratch space.
        scratch_space_(begin ? new AccessorValueType : nullptr) {}